

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pragmaVtabBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  byte bVar1;
  int iVar2;
  sqlite3_index_constraint_usage *psVar3;
  int iVar4;
  uchar *puVar5;
  long lVar6;
  PragmaVtab *pTab;
  int iVar7;
  bool bVar8;
  int seen [2];
  
  pIdxInfo->estimatedCost = 1.0;
  iVar4 = 0;
  if (*(char *)&tab[1].zErrMsg == '\0') {
    return iVar4;
  }
  seen[0] = 0;
  seen[1] = 0;
  iVar2 = pIdxInfo->nConstraint;
  if (0 < iVar2) {
    bVar1 = *(byte *)((long)&tab[1].zErrMsg + 1);
    puVar5 = &pIdxInfo->aConstraint->usable;
    iVar7 = 1;
    do {
      if (((int)(uint)bVar1 <= ((sqlite3_index_constraint *)(puVar5 + -5))->iColumn) &&
         (puVar5[-1] == '\x02')) {
        if (*puVar5 == '\0') {
          return 0x13;
        }
        seen[(long)((sqlite3_index_constraint *)(puVar5 + -5))->iColumn - (ulong)bVar1] = iVar7;
      }
      puVar5 = puVar5 + 0xc;
      bVar8 = iVar7 != iVar2;
      iVar7 = iVar7 + 1;
    } while (bVar8);
    lVar6 = (long)seen[0];
    if (lVar6 != 0) {
      psVar3 = pIdxInfo->aConstraintUsage;
      psVar3[lVar6 + -1].argvIndex = 1;
      psVar3[lVar6 + -1].omit = '\x01';
      pIdxInfo->estimatedCost = 20.0;
      pIdxInfo->estimatedRows = 0x14;
      lVar6 = (long)seen[1];
      if (lVar6 == 0) {
        return iVar4;
      }
      psVar3[lVar6 + -1].argvIndex = 2;
      psVar3[lVar6 + -1].omit = '\x01';
      return iVar4;
    }
  }
  pIdxInfo->estimatedCost = 2147483647.0;
  pIdxInfo->estimatedRows = 0x7fffffff;
  return iVar4;
}

Assistant:

static int pragmaVtabBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  PragmaVtab *pTab = (PragmaVtab*)tab;
  const struct sqlite3_index_constraint *pConstraint;
  int i, j;
  int seen[2];

  pIdxInfo->estimatedCost = (double)1;
  if( pTab->nHidden==0 ){ return SQLITE_OK; }
  pConstraint = pIdxInfo->aConstraint;
  seen[0] = 0;
  seen[1] = 0;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    if( pConstraint->iColumn < pTab->iHidden ) continue;
    if( pConstraint->op!=SQLITE_INDEX_CONSTRAINT_EQ ) continue;
    if( pConstraint->usable==0 ) return SQLITE_CONSTRAINT;
    j = pConstraint->iColumn - pTab->iHidden;
    assert( j < 2 );
    seen[j] = i+1;
  }
  if( seen[0]==0 ){
    pIdxInfo->estimatedCost = (double)2147483647;
    pIdxInfo->estimatedRows = 2147483647;
    return SQLITE_OK;
  }
  j = seen[0]-1;
  pIdxInfo->aConstraintUsage[j].argvIndex = 1;
  pIdxInfo->aConstraintUsage[j].omit = 1;
  pIdxInfo->estimatedCost = (double)20;
  pIdxInfo->estimatedRows = 20;
  if( seen[1] ){
    j = seen[1]-1;
    pIdxInfo->aConstraintUsage[j].argvIndex = 2;
    pIdxInfo->aConstraintUsage[j].omit = 1;
  }
  return SQLITE_OK;
}